

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlInitParserCtxt(htmlParserCtxtPtr ctxt)

{
  xmlDictPtr pxVar1;
  _xmlSAXHandler *p_Var2;
  xmlParserInputPtr *ppxVar3;
  xmlNodePtr *ppxVar4;
  xmlChar **ppxVar5;
  xmlSAXHandlerV1 *__src;
  int *piVar6;
  htmlSAXHandler *sax;
  htmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    memset(ctxt,0,0x300);
    pxVar1 = xmlDictCreate();
    ctxt->dict = pxVar1;
    if (ctxt->dict == (xmlDictPtr)0x0) {
      htmlErrMemory((xmlParserCtxtPtr)0x0,"htmlInitParserCtxt: out of memory\n");
      ctxt_local._4_4_ = -1;
    }
    else {
      p_Var2 = (_xmlSAXHandler *)(*xmlMalloc)(0x100);
      if (p_Var2 == (_xmlSAXHandler *)0x0) {
        htmlErrMemory((xmlParserCtxtPtr)0x0,"htmlInitParserCtxt: out of memory\n");
        ctxt_local._4_4_ = -1;
      }
      else {
        memset(p_Var2,0,0x100);
        ppxVar3 = (xmlParserInputPtr *)(*xmlMalloc)(0x28);
        ctxt->inputTab = ppxVar3;
        if (ctxt->inputTab == (xmlParserInputPtr *)0x0) {
          htmlErrMemory((xmlParserCtxtPtr)0x0,"htmlInitParserCtxt: out of memory\n");
          ctxt->inputNr = 0;
          ctxt->inputMax = 0;
          ctxt->input = (xmlParserInputPtr)0x0;
          ctxt_local._4_4_ = -1;
        }
        else {
          ctxt->inputNr = 0;
          ctxt->inputMax = 5;
          ctxt->input = (xmlParserInputPtr)0x0;
          ctxt->version = (xmlChar *)0x0;
          ctxt->encoding = (xmlChar *)0x0;
          ctxt->standalone = -1;
          ctxt->instate = XML_PARSER_START;
          ppxVar4 = (xmlNodePtr *)(*xmlMalloc)(0x50);
          ctxt->nodeTab = ppxVar4;
          if (ctxt->nodeTab == (xmlNodePtr *)0x0) {
            htmlErrMemory((xmlParserCtxtPtr)0x0,"htmlInitParserCtxt: out of memory\n");
            ctxt->nodeNr = 0;
            ctxt->nodeMax = 0;
            ctxt->node = (xmlNodePtr)0x0;
            ctxt->inputNr = 0;
            ctxt->inputMax = 0;
            ctxt->input = (xmlParserInputPtr)0x0;
            ctxt_local._4_4_ = -1;
          }
          else {
            ctxt->nodeNr = 0;
            ctxt->nodeMax = 10;
            ctxt->node = (xmlNodePtr)0x0;
            ppxVar5 = (xmlChar **)(*xmlMalloc)(0x50);
            ctxt->nameTab = ppxVar5;
            if (ctxt->nameTab == (xmlChar **)0x0) {
              htmlErrMemory((xmlParserCtxtPtr)0x0,"htmlInitParserCtxt: out of memory\n");
              ctxt->nameNr = 0;
              ctxt->nameMax = 0;
              ctxt->name = (xmlChar *)0x0;
              ctxt->nodeNr = 0;
              ctxt->nodeMax = 0;
              ctxt->node = (xmlNodePtr)0x0;
              ctxt->inputNr = 0;
              ctxt->inputMax = 0;
              ctxt->input = (xmlParserInputPtr)0x0;
              ctxt_local._4_4_ = -1;
            }
            else {
              ctxt->nameNr = 0;
              ctxt->nameMax = 10;
              ctxt->name = (xmlChar *)0x0;
              ctxt->nodeInfoTab = (xmlParserNodeInfo *)0x0;
              ctxt->nodeInfoNr = 0;
              ctxt->nodeInfoMax = 0;
              if (p_Var2 == (_xmlSAXHandler *)0x0) {
                p_Var2 = (_xmlSAXHandler *)__htmlDefaultSAXHandler();
                ctxt->sax = p_Var2;
              }
              else {
                ctxt->sax = p_Var2;
                __src = __htmlDefaultSAXHandler();
                memcpy(p_Var2,__src,0xe0);
              }
              ctxt->userData = ctxt;
              ctxt->myDoc = (xmlDocPtr)0x0;
              ctxt->wellFormed = 1;
              ctxt->replaceEntities = 0;
              piVar6 = __xmlLineNumbersDefaultValue();
              ctxt->linenumbers = *piVar6;
              piVar6 = __xmlKeepBlanksDefaultValue();
              ctxt->keepBlanks = *piVar6;
              ctxt->html = 1;
              (ctxt->vctxt).finishDtd = 0xabcd1234;
              (ctxt->vctxt).userData = ctxt;
              (ctxt->vctxt).error = xmlParserValidityError;
              (ctxt->vctxt).warning = xmlParserValidityWarning;
              ctxt->record_info = 0;
              ctxt->validate = 0;
              ctxt->checkIndex = 0;
              ctxt->catalogs = (void *)0x0;
              xmlInitNodeInfoSeq(&ctxt->node_seq);
              ctxt_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
htmlInitParserCtxt(htmlParserCtxtPtr ctxt)
{
    htmlSAXHandler *sax;

    if (ctxt == NULL) return(-1);
    memset(ctxt, 0, sizeof(htmlParserCtxt));

    ctxt->dict = xmlDictCreate();
    if (ctxt->dict == NULL) {
        htmlErrMemory(NULL, "htmlInitParserCtxt: out of memory\n");
	return(-1);
    }
    sax = (htmlSAXHandler *) xmlMalloc(sizeof(htmlSAXHandler));
    if (sax == NULL) {
        htmlErrMemory(NULL, "htmlInitParserCtxt: out of memory\n");
	return(-1);
    }
    else
        memset(sax, 0, sizeof(htmlSAXHandler));

    /* Allocate the Input stack */
    ctxt->inputTab = (htmlParserInputPtr *)
                      xmlMalloc(5 * sizeof(htmlParserInputPtr));
    if (ctxt->inputTab == NULL) {
        htmlErrMemory(NULL, "htmlInitParserCtxt: out of memory\n");
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	return(-1);
    }
    ctxt->inputNr = 0;
    ctxt->inputMax = 5;
    ctxt->input = NULL;
    ctxt->version = NULL;
    ctxt->encoding = NULL;
    ctxt->standalone = -1;
    ctxt->instate = XML_PARSER_START;

    /* Allocate the Node stack */
    ctxt->nodeTab = (htmlNodePtr *) xmlMalloc(10 * sizeof(htmlNodePtr));
    if (ctxt->nodeTab == NULL) {
        htmlErrMemory(NULL, "htmlInitParserCtxt: out of memory\n");
	ctxt->nodeNr = 0;
	ctxt->nodeMax = 0;
	ctxt->node = NULL;
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	return(-1);
    }
    ctxt->nodeNr = 0;
    ctxt->nodeMax = 10;
    ctxt->node = NULL;

    /* Allocate the Name stack */
    ctxt->nameTab = (const xmlChar **) xmlMalloc(10 * sizeof(xmlChar *));
    if (ctxt->nameTab == NULL) {
        htmlErrMemory(NULL, "htmlInitParserCtxt: out of memory\n");
	ctxt->nameNr = 0;
	ctxt->nameMax = 0;
	ctxt->name = NULL;
	ctxt->nodeNr = 0;
	ctxt->nodeMax = 0;
	ctxt->node = NULL;
	ctxt->inputNr = 0;
	ctxt->inputMax = 0;
	ctxt->input = NULL;
	return(-1);
    }
    ctxt->nameNr = 0;
    ctxt->nameMax = 10;
    ctxt->name = NULL;

    ctxt->nodeInfoTab = NULL;
    ctxt->nodeInfoNr  = 0;
    ctxt->nodeInfoMax = 0;

    if (sax == NULL) ctxt->sax = (xmlSAXHandlerPtr) &htmlDefaultSAXHandler;
    else {
        ctxt->sax = sax;
	memcpy(sax, &htmlDefaultSAXHandler, sizeof(xmlSAXHandlerV1));
    }
    ctxt->userData = ctxt;
    ctxt->myDoc = NULL;
    ctxt->wellFormed = 1;
    ctxt->replaceEntities = 0;
    ctxt->linenumbers = xmlLineNumbersDefaultValue;
    ctxt->keepBlanks = xmlKeepBlanksDefaultValue;
    ctxt->html = 1;
    ctxt->vctxt.finishDtd = XML_CTXT_FINISH_DTD_0;
    ctxt->vctxt.userData = ctxt;
    ctxt->vctxt.error = xmlParserValidityError;
    ctxt->vctxt.warning = xmlParserValidityWarning;
    ctxt->record_info = 0;
    ctxt->validate = 0;
    ctxt->checkIndex = 0;
    ctxt->catalogs = NULL;
    xmlInitNodeInfoSeq(&ctxt->node_seq);
    return(0);
}